

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_test.cpp
# Opt level: O0

int main(void)

{
  XMLError XVar1;
  ostream *poVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int_(*)(void_*)>_>::value,_pair<iterator,_bool>_>
  _Var3;
  undefined8 local_608;
  XMLElement *els [2];
  _func_uint_void_ptr *local_5e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
  local_5e0;
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  _func_uint_void_ptr *local_5a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
  local_5a0;
  _Base_ptr local_578;
  undefined1 local_570;
  _func_uint_void_ptr *local_568;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
  local_560;
  XMLElement *local_538;
  XMLElement *cmd;
  XMLDocument cmds;
  XMLElement *e;
  undefined1 local_290 [4];
  XMLError err;
  XMLDocument doc;
  
  doc._commentPool._nUntracked = 0;
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_290,true,PRESERVE_WHITESPACE);
  XVar1 = tinyxml2::XMLDocument::LoadFile
                    ((XMLDocument *)local_290,"/Users/tkorays/invoker/res/simple_task.xml");
  if (XVar1 == XML_NO_ERROR) {
    cmds._commentPool._120_8_ = tinyxml2::XMLNode::FirstChildElement((XMLNode *)local_290,"proc");
    if ((XMLElement *)cmds._commentPool._120_8_ == (XMLElement *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"root node must be a proc");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      doc._commentPool._nUntracked = 0;
    }
    else {
      tinyxml2::XMLDocument::XMLDocument((XMLDocument *)&cmd,true,PRESERVE_WHITESPACE);
      XVar1 = tinyxml2::XMLDocument::LoadFile
                        ((XMLDocument *)&cmd,"/Users/tkorays/invoker/res/mycmds.xml");
      if (XVar1 == XML_NO_ERROR) {
        local_538 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)&cmd,"cmds");
        if (local_538 == (XMLElement *)0x0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"root node must b a cmds");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        else {
          ivk::proc_add_cmds(local_538);
          ivk::proc_install();
          local_568 = cmd_a;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[6],_true>(&local_560,(char (*) [6])"cmd_a",&local_568);
          _Var3 = std::
                  map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                  ::insert<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                            ((map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                              *)ivk::gCmdFuncMap_abi_cxx11_,&local_560);
          local_578 = (_Base_ptr)_Var3.first._M_node;
          local_570 = _Var3.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::~pair(&local_560);
          local_5a8 = cmd_b;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[6],_true>(&local_5a0,(char (*) [6])"cmd_b",&local_5a8);
          _Var3 = std::
                  map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                  ::insert<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                            ((map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                              *)ivk::gCmdFuncMap_abi_cxx11_,&local_5a0);
          local_5b8 = (_Base_ptr)_Var3.first._M_node;
          local_5b0 = _Var3.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::~pair(&local_5a0);
          local_5e8 = dump;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[5],_true>(&local_5e0,(char (*) [5])"dump",&local_5e8);
          _Var3 = std::
                  map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                  ::insert<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                            ((map<std::__cxx11::string,unsigned_int(*)(void*),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                              *)ivk::gCmdFuncMap_abi_cxx11_,&local_5e0);
          els[1] = (XMLElement *)_Var3.first._M_node;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::~pair(&local_5e0);
          local_608._0_4_ = cmds._commentPool._maxAllocs;
          local_608._4_4_ = cmds._commentPool._nUntracked;
          els[0] = (XMLElement *)0x0;
          ivk::proc_exec(&local_608);
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"open file failed");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      doc._commentPool._nUntracked = 0;
      tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)&cmd);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Open File Failed");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    doc._commentPool._nUntracked = 0;
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_290);
  return doc._commentPool._nUntracked;
}

Assistant:

int main(){
    XMLDocument doc;
    XMLError err = XML_NO_ERROR;
    err = doc.LoadFile("/Users/tkorays/invoker/res/simple_task.xml");
    if(err!=XML_NO_ERROR){
        cout<<"Open File Failed"<<endl;
        return 0;
    }

    // 任务入口
    XMLElement* e = doc.FirstChildElement("proc");
    if(e==0){
        cout<<"root node must be a proc"<<endl;
        return 0;
    }

    XMLDocument cmds;
    err = cmds.LoadFile("/Users/tkorays/invoker/res/mycmds.xml");
    if(err!=XML_NO_ERROR){
        cout<<"open file failed"<<endl;
        return 0;
    }
    XMLElement* cmd = cmds.FirstChildElement("cmds");
    if(!cmd){
        cout<<"root node must b a cmds"<<endl;
        return 0;
    }
    proc_add_cmds(cmd);


    proc_install();
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_a",cmd_a));
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_b",cmd_b));
    gCmdFuncMap.insert(pair<string,cmd_func>("dump",dump));
    XMLElement* els[2];
    els[0] = e;
    els[1] = 0;
    proc_exec(els);

    return 0;
}